

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_continue_at(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  ParameterError local_2c;
  ParameterError err;
  char *nextarg_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  local_2c = PARAM_OK;
  if (config->range == (char *)0x0) {
    if ((*(uint *)&config->field_0x4dc >> 0x15 & 1) == 0) {
      if (config->file_clobber_mode == CLOBBER_NEVER) {
        errorf(config->global,"--continue-at is mutually exclusive with --no-clobber");
        global_local._4_4_ = PARAM_BAD_USE;
      }
      else {
        iVar1 = strcmp(nextarg,"-");
        if (iVar1 == 0) {
          *(ulong *)&config->field_0x4d4 =
               *(ulong *)&config->field_0x4d4 & 0xffffffffffffffdf | 0x20;
          config->resume_from = 0;
        }
        else {
          local_2c = str2offset(&config->resume_from,nextarg);
          *(ulong *)&config->field_0x4d4 = *(ulong *)&config->field_0x4d4 & 0xffffffffffffffdf;
        }
        *(ulong *)&config->field_0x4d4 = *(ulong *)&config->field_0x4d4 & 0xffffffffffffffef | 0x10;
        global_local._4_4_ = local_2c;
      }
    }
    else {
      errorf(config->global,"--continue-at is mutually exclusive with --remove-on-error");
      global_local._4_4_ = PARAM_BAD_USE;
    }
  }
  else {
    errorf(global,"--continue-at is mutually exclusive with --range");
    global_local._4_4_ = PARAM_BAD_USE;
  }
  return global_local._4_4_;
}

Assistant:

static ParameterError parse_continue_at(struct GlobalConfig *global,
                                        struct OperationConfig *config,
                                        const char *nextarg)
{
  ParameterError err = PARAM_OK;
  if(config->range) {
    errorf(global, "--continue-at is mutually exclusive with --range");
    return PARAM_BAD_USE;
  }
  if(config->rm_partial) {
    errorf(config->global,
           "--continue-at is mutually exclusive with --remove-on-error");
    return PARAM_BAD_USE;
  }
  if(config->file_clobber_mode == CLOBBER_NEVER) {
    errorf(config->global,
           "--continue-at is mutually exclusive with --no-clobber");
    return PARAM_BAD_USE;
  }
  /* This makes us continue an ftp transfer at given position */
  if(strcmp(nextarg, "-")) {
    err = str2offset(&config->resume_from, nextarg);
    config->resume_from_current = FALSE;
  }
  else {
    config->resume_from_current = TRUE;
    config->resume_from = 0;
  }
  config->use_resume = TRUE;
  return err;
}